

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::UpdateBuffer
          (DeviceContextVkImpl *this,IBuffer *pBuffer,Uint64 Offset,Uint64 Size,void *pData,
          RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)

{
  BufferVkImpl *pBuffVk;
  VulkanUploadAllocation TmpSpace;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::UpdateBuffer
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pBuffer,Offset,Size,pData,
             StateTransitionMode);
  pBuffVk = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(pBuffer);
  if ((pBuffVk->super_BufferBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
      .m_Desc.Usage == USAGE_DYNAMIC) {
    FormatString<char[42]>
              ((string *)&TmpSpace,(char (*) [42])"Dynamic buffers must be updated via Map()");
    DebugAssertionFailed
              ((Char *)TmpSpace.vkBuffer,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x844);
    std::__cxx11::string::~string((string *)&TmpSpace);
  }
  VulkanUploadHeap::Allocate(&TmpSpace,&this->m_UploadHeap,Size,4);
  memcpy(TmpSpace.CPUAddress,pData,Size);
  UpdateBufferRegion(this,pBuffVk,Offset,Size,TmpSpace.vkBuffer,TmpSpace.AlignedOffset,
                     StateTransitionMode);
  return;
}

Assistant:

void DeviceContextVkImpl::UpdateBuffer(IBuffer*                       pBuffer,
                                       Uint64                         Offset,
                                       Uint64                         Size,
                                       const void*                    pData,
                                       RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)
{
    TDeviceContextBase::UpdateBuffer(pBuffer, Offset, Size, pData, StateTransitionMode);

    // We must use cmd context from the device context provided, otherwise there will
    // be resource barrier issues in the cmd list in the device context
    BufferVkImpl* pBuffVk = ClassPtrCast<BufferVkImpl>(pBuffer);

    DEV_CHECK_ERR(pBuffVk->GetDesc().Usage != USAGE_DYNAMIC, "Dynamic buffers must be updated via Map()");

    constexpr size_t Alignment = 4;
    // Source buffer offset must be multiple of 4 (18.4)
    VulkanUploadAllocation TmpSpace = m_UploadHeap.Allocate(Size, Alignment);
    memcpy(TmpSpace.CPUAddress, pData, StaticCast<size_t>(Size));
    UpdateBufferRegion(pBuffVk, Offset, Size, TmpSpace.vkBuffer, TmpSpace.AlignedOffset, StateTransitionMode);
    // The allocation will stay in the upload heap until the end of the frame at which point all upload
    // pages will be discarded
}